

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

void do_reflect(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
               jvirt_barray_ptr *src_coef_arrays,JDIMENSION drop_width,JDIMENSION drop_height)

{
  JBLOCKROW paJVar1;
  jpeg_component_info *pjVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  uint uVar7;
  int iVar8;
  JBLOCKARRAY ppaJVar9;
  JBLOCKROW paJVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  JBLOCKROW paJVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  JDIMENSION JVar21;
  undefined4 uVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  
  if (0 < dstinfo->num_components) {
    lVar16 = 0;
    do {
      pjVar2 = dstinfo->comp_info;
      uVar13 = pjVar2[lVar16].v_samp_factor * drop_height;
      if (uVar13 != 0) {
        uVar19 = pjVar2[lVar16].h_samp_factor * x_crop_offset;
        uVar20 = pjVar2[lVar16].h_samp_factor * drop_width;
        JVar21 = 0;
        do {
          ppaJVar9 = (*srcinfo->mem->access_virt_barray)
                               ((j_common_ptr)srcinfo,src_coef_arrays[lVar16],JVar21,
                                pjVar2[lVar16].v_samp_factor,1);
          auVar28._8_8_ = extraout_XMM1_Qb;
          auVar28._0_8_ = extraout_XMM1_Qa;
          iVar8 = pjVar2[lVar16].v_samp_factor;
          if (0 < iVar8) {
            lVar15 = 0;
            do {
              if (uVar19 == 0) {
                uVar11 = pjVar2[lVar16].width_in_blocks - uVar20;
                if (pjVar2[lVar16].width_in_blocks < uVar20 || uVar11 == 0) {
                  memset(ppaJVar9[lVar15],0,(ulong)uVar20 * 0x80);
                }
                else if (uVar20 != 0) {
                  paJVar14 = ppaJVar9[lVar15] + uVar20;
                  uVar17 = uVar11;
                  paJVar10 = paJVar14;
                  uVar12 = uVar20;
                  uVar7 = uVar11;
joined_r0x00113f20:
                  do {
                    if (uVar7 != 0) {
                      paJVar1 = paJVar14 + -1;
                      lVar18 = -0x20;
                      do {
                        auVar22 = *(undefined1 (*) [16])(paJVar10[1] + lVar18 * 2);
                        auVar28 = pshuflw(auVar28,auVar22,0xe7);
                        auVar28 = pshufhw(auVar28,auVar28,0xe7);
                        auVar30._0_4_ = auVar28._0_4_;
                        auVar30._8_4_ = auVar28._8_4_;
                        auVar30._12_4_ = auVar28._12_4_;
                        auVar30._4_4_ = auVar30._8_4_;
                        auVar28 = pshuflw(auVar30,auVar30,0xb1);
                        auVar22 = pshuflw(auVar22,auVar22,0xe8);
                        auVar22 = pshufhw(auVar22,auVar22,0xe8);
                        uVar27 = auVar22._8_4_;
                        auVar26._0_10_ = (unkuint10)CONCAT44(uVar27,uVar27) << 0x20;
                        auVar6._8_2_ = auVar22._10_2_;
                        auVar6._0_8_ = CONCAT44(uVar27,uVar27);
                        auVar6._10_2_ = -auVar28._6_2_;
                        auVar26._12_4_ = auVar6._8_4_;
                        auVar26._10_2_ = -auVar28._4_2_;
                        auVar4._4_2_ = auVar22._8_2_;
                        auVar4._0_4_ = uVar27;
                        auVar4._6_6_ = auVar26._10_6_;
                        auVar25._8_8_ = auVar4._4_8_;
                        auVar25._6_2_ = -auVar28._2_2_;
                        auVar25._4_2_ = auVar22._2_2_;
                        auVar25._0_2_ = auVar22._0_2_;
                        auVar25._2_2_ = -auVar28._0_2_;
                        *(undefined1 (*) [16])(*paJVar14 + lVar18 * 2) = auVar25;
                        lVar18 = lVar18 + 4;
                      } while (lVar18 != 0);
                      uVar12 = uVar12 - 1;
                      paJVar14 = paJVar1;
                      if (uVar17 - 1 != 0) {
                        uVar17 = uVar17 - 1;
                        paJVar10 = paJVar10 + 1;
                        uVar7 = uVar12;
                        goto joined_r0x00113f20;
                      }
                    }
                    uVar17 = uVar11;
                    paJVar10 = paJVar14;
                    uVar7 = uVar11;
                  } while (uVar12 != 0);
                }
              }
              else if (uVar20 != 0) {
                paJVar10 = ppaJVar9[lVar15] + uVar19;
                paJVar14 = paJVar10;
                uVar11 = uVar20;
                uVar17 = uVar19;
                do {
                  lVar18 = 0;
                  do {
                    auVar22 = *(undefined1 (*) [16])(paJVar14[-1] + lVar18 * 2);
                    auVar28 = pshuflw(auVar28,auVar22,0xe7);
                    auVar28 = pshufhw(auVar28,auVar28,0xe7);
                    auVar29._0_4_ = auVar28._0_4_;
                    auVar29._8_4_ = auVar28._8_4_;
                    auVar29._12_4_ = auVar28._12_4_;
                    auVar29._4_4_ = auVar29._8_4_;
                    auVar28 = pshuflw(auVar29,auVar29,0xb1);
                    auVar22 = pshuflw(auVar22,auVar22,0xe8);
                    auVar22 = pshufhw(auVar22,auVar22,0xe8);
                    uVar27 = auVar22._8_4_;
                    auVar24._0_10_ = (unkuint10)CONCAT44(uVar27,uVar27) << 0x20;
                    auVar5._8_2_ = auVar22._10_2_;
                    auVar5._0_8_ = CONCAT44(uVar27,uVar27);
                    auVar5._10_2_ = -auVar28._6_2_;
                    auVar24._12_4_ = auVar5._8_4_;
                    auVar24._10_2_ = -auVar28._4_2_;
                    auVar3._4_2_ = auVar22._8_2_;
                    auVar3._0_4_ = uVar27;
                    auVar3._6_6_ = auVar24._10_6_;
                    auVar23._8_8_ = auVar3._4_8_;
                    auVar23._6_2_ = -auVar28._2_2_;
                    auVar23._4_2_ = auVar22._2_2_;
                    auVar23._0_2_ = auVar22._0_2_;
                    auVar23._2_2_ = -auVar28._0_2_;
                    *(undefined1 (*) [16])(*paJVar10 + lVar18 * 2) = auVar23;
                    lVar18 = lVar18 + 4;
                  } while (lVar18 != 0x20);
                  paJVar10 = paJVar10 + 1;
                  uVar17 = uVar17 - 1;
                  uVar11 = uVar11 - 1;
                  paJVar14 = paJVar14 + -1;
                } while ((uVar17 != 0 && uVar11 != 0) ||
                        (paJVar14 = paJVar10, uVar17 = uVar19, uVar11 != 0));
              }
              lVar15 = lVar15 + 1;
              iVar8 = pjVar2[lVar16].v_samp_factor;
            } while (lVar15 < iVar8);
          }
          JVar21 = JVar21 + iVar8;
        } while (JVar21 < uVar13);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < dstinfo->num_components);
  }
  return;
}

Assistant:

LOCAL(void)
do_reflect(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
           JDIMENSION x_crop_offset, jvirt_barray_ptr *src_coef_arrays,
           JDIMENSION drop_width, JDIMENSION drop_height)
/* Reflect - discard image contents of specified region, similarly to wipe,
 * but fill with repeated reflections of the outside region instead of zero.
 * NB: y_crop_offset is assumed to be zero.
 */
{
  JDIMENSION x_wipe_blocks, wipe_width;
  JDIMENSION y_wipe_blocks, wipe_bottom;
  JDIMENSION src_blk_x, dst_blk_x;
  int ci, k, offset_y;
  JBLOCKARRAY buffer;
  JBLOCKROW src_row_ptr, dst_row_ptr;
  JCOEFPTR src_ptr, dst_ptr;
  jpeg_component_info *compptr;

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    x_wipe_blocks = x_crop_offset * compptr->h_samp_factor;
    wipe_width = drop_width * compptr->h_samp_factor;
    wipe_bottom = drop_height * compptr->v_samp_factor;
    for (y_wipe_blocks = 0; y_wipe_blocks < wipe_bottom;
         y_wipe_blocks += compptr->v_samp_factor) {
      buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], y_wipe_blocks,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        if (x_wipe_blocks > 0) {
          /* Reflect from left */
          dst_row_ptr = buffer[offset_y] + x_wipe_blocks;
          for (dst_blk_x = wipe_width; dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;     /* (re)set axis of reflection */
            for (src_blk_x = x_wipe_blocks;
                 src_blk_x > 0 && dst_blk_x > 0; src_blk_x--, dst_blk_x--) {
              dst_ptr = *dst_row_ptr++;    /* destination goes right */
              src_ptr = *(--src_row_ptr);  /* source goes left */
              /* this unrolled loop doesn't need to know which row it's on... */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;   /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign change */
              }
            }
          }
        } else if (compptr->width_in_blocks > x_wipe_blocks + wipe_width) {
          /* Reflect from right */
          dst_row_ptr = buffer[offset_y] + x_wipe_blocks + wipe_width;
          for (dst_blk_x = wipe_width; dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;     /* (re)set axis of reflection */
            src_blk_x = compptr->width_in_blocks - x_wipe_blocks - wipe_width;
            for (; src_blk_x > 0 && dst_blk_x > 0; src_blk_x--, dst_blk_x--) {
              dst_ptr = *(--dst_row_ptr);  /* destination goes left */
              src_ptr = *src_row_ptr++;    /* source goes right */
              /* this unrolled loop doesn't need to know which row it's on... */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;   /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign change */
              }
            }
          }
        } else {
          MEMZERO(buffer[offset_y] + x_wipe_blocks,
                  wipe_width * sizeof(JBLOCK));
        }
      }
    }
  }
}